

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  Geometry *pGVar8;
  float fVar9;
  undefined1 auVar10 [32];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  undefined4 uVar29;
  AABBNodeMB4D *node1;
  ulong uVar30;
  RayHitK<4> *pRVar32;
  Scene *pSVar33;
  long lVar34;
  ulong uVar35;
  undefined1 (*pauVar36) [16];
  ulong uVar37;
  undefined1 (*pauVar38) [16];
  long lVar39;
  ulong uVar40;
  undefined1 (*pauVar41) [16];
  undefined1 (*pauVar42) [16];
  ulong uVar43;
  ulong unaff_R13;
  size_t mask;
  long lVar44;
  ulong uVar45;
  long lVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [64];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [64];
  undefined1 auVar107 [16];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  float fVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar113 [64];
  undefined1 auVar117 [16];
  undefined1 auVar118 [64];
  undefined1 auVar119 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_27b9;
  ulong local_27b8;
  ulong local_27b0;
  RayHitK<4> *local_27a8;
  Scene *local_27a0;
  undefined8 uStack_2798;
  undefined1 local_2790 [16];
  undefined1 local_2780 [16];
  undefined1 local_2770 [16];
  long local_2758;
  long local_2750;
  ulong local_2748;
  undefined1 local_2740 [16];
  undefined8 local_2730;
  undefined8 uStack_2728;
  undefined8 *local_2718;
  ulong local_2710;
  ulong local_2708;
  ulong local_2700;
  ulong local_26f8;
  undefined8 *local_26f0;
  void *local_26e8;
  RTCRayQueryContext *local_26e0;
  RayHitK<4> *local_26d8;
  undefined1 (*local_26d0) [16];
  undefined4 local_26c8;
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [16];
  undefined1 *local_2690;
  undefined1 local_2680 [16];
  undefined1 local_2670 [16];
  undefined1 local_2660 [16];
  undefined1 local_2650 [16];
  undefined1 local_2640 [16];
  undefined1 local_2630 [16];
  undefined1 local_2620 [2] [16];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined1 local_2580 [16];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined4 local_2510;
  undefined4 uStack_250c;
  undefined4 uStack_2508;
  undefined4 uStack_2504;
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  ulong uVar31;
  
  pauVar42 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar29 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_23c0._4_4_ = uVar29;
  local_23c0._0_4_ = uVar29;
  local_23c0._8_4_ = uVar29;
  local_23c0._12_4_ = uVar29;
  local_23c0._16_4_ = uVar29;
  local_23c0._20_4_ = uVar29;
  local_23c0._24_4_ = uVar29;
  local_23c0._28_4_ = uVar29;
  auVar93 = ZEXT3264(local_23c0);
  uVar29 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_23e0._4_4_ = uVar29;
  local_23e0._0_4_ = uVar29;
  local_23e0._8_4_ = uVar29;
  local_23e0._12_4_ = uVar29;
  local_23e0._16_4_ = uVar29;
  local_23e0._20_4_ = uVar29;
  local_23e0._24_4_ = uVar29;
  local_23e0._28_4_ = uVar29;
  auVar99 = ZEXT3264(local_23e0);
  uVar29 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_2400._4_4_ = uVar29;
  local_2400._0_4_ = uVar29;
  local_2400._8_4_ = uVar29;
  local_2400._12_4_ = uVar29;
  local_2400._16_4_ = uVar29;
  local_2400._20_4_ = uVar29;
  local_2400._24_4_ = uVar29;
  local_2400._28_4_ = uVar29;
  auVar102 = ZEXT3264(local_2400);
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar19 = fVar1 * 0.99999964;
  local_2420._4_4_ = fVar19;
  local_2420._0_4_ = fVar19;
  local_2420._8_4_ = fVar19;
  local_2420._12_4_ = fVar19;
  local_2420._16_4_ = fVar19;
  local_2420._20_4_ = fVar19;
  local_2420._24_4_ = fVar19;
  local_2420._28_4_ = fVar19;
  auVar103 = ZEXT3264(local_2420);
  fVar19 = fVar2 * 0.99999964;
  local_2440._4_4_ = fVar19;
  local_2440._0_4_ = fVar19;
  local_2440._8_4_ = fVar19;
  local_2440._12_4_ = fVar19;
  local_2440._16_4_ = fVar19;
  local_2440._20_4_ = fVar19;
  local_2440._24_4_ = fVar19;
  local_2440._28_4_ = fVar19;
  auVar106 = ZEXT3264(local_2440);
  fVar19 = fVar3 * 0.99999964;
  local_2460._4_4_ = fVar19;
  local_2460._0_4_ = fVar19;
  local_2460._8_4_ = fVar19;
  local_2460._12_4_ = fVar19;
  local_2460._16_4_ = fVar19;
  local_2460._20_4_ = fVar19;
  local_2460._24_4_ = fVar19;
  local_2460._28_4_ = fVar19;
  auVar108 = ZEXT3264(local_2460);
  fVar1 = fVar1 * 1.0000004;
  local_2480._4_4_ = fVar1;
  local_2480._0_4_ = fVar1;
  local_2480._8_4_ = fVar1;
  local_2480._12_4_ = fVar1;
  local_2480._16_4_ = fVar1;
  local_2480._20_4_ = fVar1;
  local_2480._24_4_ = fVar1;
  local_2480._28_4_ = fVar1;
  auVar109 = ZEXT3264(local_2480);
  fVar2 = fVar2 * 1.0000004;
  local_24a0._4_4_ = fVar2;
  local_24a0._0_4_ = fVar2;
  local_24a0._8_4_ = fVar2;
  local_24a0._12_4_ = fVar2;
  local_24a0._16_4_ = fVar2;
  local_24a0._20_4_ = fVar2;
  local_24a0._24_4_ = fVar2;
  local_24a0._28_4_ = fVar2;
  auVar113 = ZEXT3264(local_24a0);
  fVar3 = fVar3 * 1.0000004;
  local_24c0._4_4_ = fVar3;
  local_24c0._0_4_ = fVar3;
  local_24c0._8_4_ = fVar3;
  local_24c0._12_4_ = fVar3;
  local_24c0._16_4_ = fVar3;
  local_24c0._20_4_ = fVar3;
  local_24c0._24_4_ = fVar3;
  local_24c0._28_4_ = fVar3;
  auVar118 = ZEXT3264(local_24c0);
  uVar35 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_2708 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_2710 = uVar35 ^ 0x20;
  local_26f8 = uVar40 ^ 0x20;
  iVar28 = (tray->tnear).field_0.i[k];
  local_2600._4_4_ = iVar28;
  local_2600._0_4_ = iVar28;
  local_2600._8_4_ = iVar28;
  local_2600._12_4_ = iVar28;
  local_2600._16_4_ = iVar28;
  local_2600._20_4_ = iVar28;
  local_2600._24_4_ = iVar28;
  local_2600._28_4_ = iVar28;
  auVar119 = ZEXT3264(local_2600);
  iVar28 = (tray->tfar).field_0.i[k];
  auVar53 = ZEXT3264(CONCAT428(iVar28,CONCAT424(iVar28,CONCAT420(iVar28,CONCAT416(iVar28,CONCAT412(
                                                  iVar28,CONCAT48(iVar28,CONCAT44(iVar28,iVar28)))))
                                               )));
  local_2700 = local_2708 ^ 0x20;
  local_2718 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  uVar31 = local_2708;
  uVar45 = local_2710;
  local_27b8 = uVar40;
  local_27b0 = uVar35;
  local_27a8 = ray;
  do {
    do {
      do {
        if (pauVar42 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar41 = pauVar42 + -1;
        pauVar42 = pauVar42 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar41 + 8));
      uVar43 = *(ulong *)*pauVar42;
      do {
        auVar101 = auVar102._0_32_;
        auVar98 = auVar99._0_32_;
        auVar92 = auVar93._0_32_;
        if ((uVar43 & 8) == 0) {
          uVar30 = uVar43 & 0xfffffffffffffff0;
          uVar29 = *(undefined4 *)(ray + k * 4 + 0x70);
          auVar60._4_4_ = uVar29;
          auVar60._0_4_ = uVar29;
          auVar60._8_4_ = uVar29;
          auVar60._12_4_ = uVar29;
          auVar60._16_4_ = uVar29;
          auVar60._20_4_ = uVar29;
          auVar60._24_4_ = uVar29;
          auVar60._28_4_ = uVar29;
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x100 + uVar35),auVar60,
                                    *(undefined1 (*) [32])(uVar30 + 0x40 + uVar35));
          auVar20 = vsubps_avx(ZEXT1632(auVar54),auVar92);
          auVar21._4_4_ = auVar103._4_4_ * auVar20._4_4_;
          auVar21._0_4_ = auVar103._0_4_ * auVar20._0_4_;
          auVar21._8_4_ = auVar103._8_4_ * auVar20._8_4_;
          auVar21._12_4_ = auVar103._12_4_ * auVar20._12_4_;
          auVar21._16_4_ = auVar103._16_4_ * auVar20._16_4_;
          auVar21._20_4_ = auVar103._20_4_ * auVar20._20_4_;
          auVar21._24_4_ = auVar103._24_4_ * auVar20._24_4_;
          auVar21._28_4_ = auVar20._28_4_;
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x100 + uVar40),auVar60,
                                    *(undefined1 (*) [32])(uVar30 + 0x40 + uVar40));
          auVar20 = vmaxps_avx(auVar119._0_32_,auVar21);
          auVar21 = vsubps_avx(ZEXT1632(auVar54),auVar98);
          auVar10._4_4_ = auVar106._4_4_ * auVar21._4_4_;
          auVar10._0_4_ = auVar106._0_4_ * auVar21._0_4_;
          auVar10._8_4_ = auVar106._8_4_ * auVar21._8_4_;
          auVar10._12_4_ = auVar106._12_4_ * auVar21._12_4_;
          auVar10._16_4_ = auVar106._16_4_ * auVar21._16_4_;
          auVar10._20_4_ = auVar106._20_4_ * auVar21._20_4_;
          auVar10._24_4_ = auVar106._24_4_ * auVar21._24_4_;
          auVar10._28_4_ = auVar21._28_4_;
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x100 + uVar31),auVar60,
                                    *(undefined1 (*) [32])(uVar30 + 0x40 + uVar31));
          auVar21 = vsubps_avx(ZEXT1632(auVar54),auVar101);
          auVar22._4_4_ = auVar108._4_4_ * auVar21._4_4_;
          auVar22._0_4_ = auVar108._0_4_ * auVar21._0_4_;
          auVar22._8_4_ = auVar108._8_4_ * auVar21._8_4_;
          auVar22._12_4_ = auVar108._12_4_ * auVar21._12_4_;
          auVar22._16_4_ = auVar108._16_4_ * auVar21._16_4_;
          auVar22._20_4_ = auVar108._20_4_ * auVar21._20_4_;
          auVar22._24_4_ = auVar108._24_4_ * auVar21._24_4_;
          auVar22._28_4_ = auVar21._28_4_;
          auVar21 = vmaxps_avx(auVar10,auVar22);
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x100 + uVar45),auVar60,
                                    *(undefined1 (*) [32])(uVar30 + 0x40 + uVar45));
          local_26c0 = vmaxps_avx(auVar20,auVar21);
          auVar20 = vsubps_avx(ZEXT1632(auVar54),auVar92);
          auVar23._4_4_ = auVar109._4_4_ * auVar20._4_4_;
          auVar23._0_4_ = auVar109._0_4_ * auVar20._0_4_;
          auVar23._8_4_ = auVar109._8_4_ * auVar20._8_4_;
          auVar23._12_4_ = auVar109._12_4_ * auVar20._12_4_;
          auVar23._16_4_ = auVar109._16_4_ * auVar20._16_4_;
          auVar23._20_4_ = auVar109._20_4_ * auVar20._20_4_;
          auVar23._24_4_ = auVar109._24_4_ * auVar20._24_4_;
          auVar23._28_4_ = auVar20._28_4_;
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x100 + local_26f8),auVar60,
                                    *(undefined1 (*) [32])(uVar30 + 0x40 + local_26f8));
          auVar20 = vsubps_avx(ZEXT1632(auVar54),auVar98);
          auVar24._4_4_ = auVar113._4_4_ * auVar20._4_4_;
          auVar24._0_4_ = auVar113._0_4_ * auVar20._0_4_;
          auVar24._8_4_ = auVar113._8_4_ * auVar20._8_4_;
          auVar24._12_4_ = auVar113._12_4_ * auVar20._12_4_;
          auVar24._16_4_ = auVar113._16_4_ * auVar20._16_4_;
          auVar24._20_4_ = auVar113._20_4_ * auVar20._20_4_;
          auVar24._24_4_ = auVar113._24_4_ * auVar20._24_4_;
          auVar24._28_4_ = auVar20._28_4_;
          auVar54 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar30 + 0x100 + local_2700),auVar60,
                                    *(undefined1 (*) [32])(uVar30 + 0x40 + local_2700));
          auVar20 = vsubps_avx(ZEXT1632(auVar54),auVar101);
          auVar25._4_4_ = auVar118._4_4_ * auVar20._4_4_;
          auVar25._0_4_ = auVar118._0_4_ * auVar20._0_4_;
          auVar25._8_4_ = auVar118._8_4_ * auVar20._8_4_;
          auVar25._12_4_ = auVar118._12_4_ * auVar20._12_4_;
          auVar25._16_4_ = auVar118._16_4_ * auVar20._16_4_;
          auVar25._20_4_ = auVar118._20_4_ * auVar20._20_4_;
          auVar25._24_4_ = auVar118._24_4_ * auVar20._24_4_;
          auVar25._28_4_ = auVar20._28_4_;
          auVar20 = vminps_avx(auVar24,auVar25);
          auVar21 = vminps_avx(auVar53._0_32_,auVar23);
          auVar20 = vminps_avx(auVar21,auVar20);
          auVar20 = vcmpps_avx(local_26c0,auVar20,2);
          if (((uint)uVar43 & 7) == 6) {
            auVar21 = vcmpps_avx(*(undefined1 (*) [32])(uVar30 + 0x1c0),auVar60,2);
            auVar10 = vcmpps_avx(auVar60,*(undefined1 (*) [32])(uVar30 + 0x1e0),1);
            auVar21 = vandps_avx(auVar21,auVar10);
            auVar20 = vandps_avx(auVar21,auVar20);
            auVar54 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
          }
          else {
            auVar54 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
          }
          auVar54 = vpsllw_avx(auVar54,0xf);
          auVar54 = vpacksswb_avx(auVar54,auVar54);
          unaff_R13 = (ulong)(byte)(SUB161(auVar54 >> 7,0) & 1 | (SUB161(auVar54 >> 0xf,0) & 1) << 1
                                    | (SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                                    (SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                                    (SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                                    (SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                                    (SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                                   SUB161(auVar54 >> 0x3f,0) << 7);
        }
        if ((uVar43 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar28 = 4;
          }
          else {
            uVar30 = uVar43 & 0xfffffffffffffff0;
            lVar34 = 0;
            for (uVar43 = unaff_R13; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
              lVar34 = lVar34 + 1;
            }
            iVar28 = 0;
            uVar37 = unaff_R13 - 1 & unaff_R13;
            uVar43 = *(ulong *)(uVar30 + lVar34 * 8);
            if (uVar37 != 0) {
              uVar6 = *(uint *)(local_26c0 + lVar34 * 4);
              lVar34 = 0;
              for (uVar35 = uVar37; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
                lVar34 = lVar34 + 1;
              }
              uVar37 = uVar37 - 1 & uVar37;
              uVar7 = *(ulong *)(uVar30 + lVar34 * 8);
              uVar5 = *(uint *)(local_26c0 + lVar34 * 4);
              uVar35 = local_27b0;
              uVar40 = local_27b8;
              if (uVar37 == 0) {
                if (uVar6 < uVar5) {
                  *(ulong *)*pauVar42 = uVar7;
                  *(uint *)(*pauVar42 + 8) = uVar5;
                  pauVar42 = pauVar42 + 1;
                }
                else {
                  *(ulong *)*pauVar42 = uVar43;
                  *(uint *)(*pauVar42 + 8) = uVar6;
                  pauVar42 = pauVar42 + 1;
                  uVar43 = uVar7;
                }
              }
              else {
                auVar54._8_8_ = 0;
                auVar54._0_8_ = uVar43;
                auVar54 = vpunpcklqdq_avx(auVar54,ZEXT416(uVar6));
                auVar61._8_8_ = 0;
                auVar61._0_8_ = uVar7;
                auVar61 = vpunpcklqdq_avx(auVar61,ZEXT416(uVar5));
                lVar34 = 0;
                for (uVar43 = uVar37; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000)
                {
                  lVar34 = lVar34 + 1;
                }
                uVar37 = uVar37 - 1 & uVar37;
                auVar68._8_8_ = 0;
                auVar68._0_8_ = *(ulong *)(uVar30 + lVar34 * 8);
                auVar55 = vpunpcklqdq_avx(auVar68,ZEXT416(*(uint *)(local_26c0 + lVar34 * 4)));
                auVar68 = vpcmpgtd_avx(auVar61,auVar54);
                if (uVar37 == 0) {
                  auVar82 = vpshufd_avx(auVar68,0xaa);
                  auVar68 = vblendvps_avx(auVar61,auVar54,auVar82);
                  auVar54 = vblendvps_avx(auVar54,auVar61,auVar82);
                  auVar61 = vpcmpgtd_avx(auVar55,auVar68);
                  auVar82 = vpshufd_avx(auVar61,0xaa);
                  auVar61 = vblendvps_avx(auVar55,auVar68,auVar82);
                  auVar68 = vblendvps_avx(auVar68,auVar55,auVar82);
                  auVar55 = vpcmpgtd_avx(auVar68,auVar54);
                  auVar82 = vpshufd_avx(auVar55,0xaa);
                  auVar55 = vblendvps_avx(auVar68,auVar54,auVar82);
                  auVar54 = vblendvps_avx(auVar54,auVar68,auVar82);
                  *pauVar42 = auVar54;
                  pauVar42[1] = auVar55;
                  uVar43 = auVar61._0_8_;
                  pauVar42 = pauVar42 + 2;
                }
                else {
                  lVar34 = 0;
                  for (uVar43 = uVar37; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000
                      ) {
                    lVar34 = lVar34 + 1;
                  }
                  uVar37 = uVar37 - 1 & uVar37;
                  auVar82._8_8_ = 0;
                  auVar82._0_8_ = *(ulong *)(uVar30 + lVar34 * 8);
                  auVar82 = vpunpcklqdq_avx(auVar82,ZEXT416(*(uint *)(local_26c0 + lVar34 * 4)));
                  if (uVar37 == 0) {
                    auVar57 = vpshufd_avx(auVar68,0xaa);
                    auVar68 = vblendvps_avx(auVar61,auVar54,auVar57);
                    auVar54 = vblendvps_avx(auVar54,auVar61,auVar57);
                    auVar61 = vpcmpgtd_avx(auVar82,auVar55);
                    auVar57 = vpshufd_avx(auVar61,0xaa);
                    auVar61 = vblendvps_avx(auVar82,auVar55,auVar57);
                    auVar55 = vblendvps_avx(auVar55,auVar82,auVar57);
                    auVar82 = vpcmpgtd_avx(auVar55,auVar54);
                    auVar57 = vpshufd_avx(auVar82,0xaa);
                    auVar82 = vblendvps_avx(auVar55,auVar54,auVar57);
                    auVar54 = vblendvps_avx(auVar54,auVar55,auVar57);
                    auVar55 = vpcmpgtd_avx(auVar61,auVar68);
                    auVar57 = vpshufd_avx(auVar55,0xaa);
                    auVar55 = vblendvps_avx(auVar61,auVar68,auVar57);
                    auVar61 = vblendvps_avx(auVar68,auVar61,auVar57);
                    auVar68 = vpcmpgtd_avx(auVar82,auVar61);
                    auVar57 = vpshufd_avx(auVar68,0xaa);
                    auVar68 = vblendvps_avx(auVar82,auVar61,auVar57);
                    auVar61 = vblendvps_avx(auVar61,auVar82,auVar57);
                    *pauVar42 = auVar54;
                    pauVar42[1] = auVar61;
                    pauVar42[2] = auVar68;
                    uVar43 = auVar55._0_8_;
                    pauVar41 = pauVar42 + 3;
                  }
                  else {
                    *pauVar42 = auVar54;
                    pauVar42[1] = auVar61;
                    pauVar42[2] = auVar55;
                    pauVar42[3] = auVar82;
                    lVar34 = 0x30;
                    do {
                      lVar39 = lVar34;
                      lVar34 = 0;
                      for (uVar43 = uVar37; (uVar43 & 1) == 0;
                          uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                        lVar34 = lVar34 + 1;
                      }
                      auVar55._8_8_ = 0;
                      auVar55._0_8_ = *(ulong *)(uVar30 + lVar34 * 8);
                      auVar54 = vpunpcklqdq_avx(auVar55,ZEXT416(*(uint *)(local_26c0 + lVar34 * 4)))
                      ;
                      *(undefined1 (*) [16])(pauVar42[1] + lVar39) = auVar54;
                      uVar37 = uVar37 - 1 & uVar37;
                      lVar34 = lVar39 + 0x10;
                    } while (uVar37 != 0);
                    pauVar41 = (undefined1 (*) [16])(pauVar42[1] + lVar39);
                    if (lVar39 + 0x10 != 0) {
                      lVar34 = 0x10;
                      pauVar36 = pauVar42;
                      do {
                        auVar54 = pauVar36[1];
                        uVar6 = *(uint *)(pauVar36[1] + 8);
                        pauVar36 = pauVar36 + 1;
                        lVar39 = lVar34;
                        do {
                          if (uVar6 <= *(uint *)(pauVar42[-1] + lVar39 + 8)) {
                            pauVar38 = (undefined1 (*) [16])(*pauVar42 + lVar39);
                            break;
                          }
                          *(undefined1 (*) [16])(*pauVar42 + lVar39) =
                               *(undefined1 (*) [16])(pauVar42[-1] + lVar39);
                          lVar39 = lVar39 + -0x10;
                          pauVar38 = pauVar42;
                        } while (lVar39 != 0);
                        *pauVar38 = auVar54;
                        lVar34 = lVar34 + 0x10;
                      } while (pauVar41 != pauVar36);
                    }
                    uVar43 = *(ulong *)*pauVar41;
                  }
                  auVar93 = ZEXT3264(auVar92);
                  auVar99 = ZEXT3264(auVar98);
                  auVar102 = ZEXT3264(auVar101);
                  auVar103 = ZEXT3264(auVar103._0_32_);
                  auVar106 = ZEXT3264(auVar106._0_32_);
                  auVar108 = ZEXT3264(auVar108._0_32_);
                  auVar109 = ZEXT3264(auVar109._0_32_);
                  auVar113 = ZEXT3264(auVar113._0_32_);
                  auVar118 = ZEXT3264(auVar118._0_32_);
                  auVar119 = ZEXT3264(local_2600);
                  ray = local_27a8;
                  pauVar42 = pauVar41;
                  iVar28 = 0;
                }
              }
            }
          }
        }
        else {
          iVar28 = 6;
        }
      } while (iVar28 == 0);
    } while (iVar28 != 6);
    lVar34 = (ulong)((uint)uVar43 & 0xf) - 8;
    if (lVar34 != 0) {
      uVar43 = uVar43 & 0xfffffffffffffff0;
      lVar39 = 0;
      local_2748 = unaff_R13;
      do {
        lVar46 = lVar39 * 0x140;
        uVar29 = *(undefined4 *)(ray + k * 4 + 0x70);
        auVar74._4_4_ = uVar29;
        auVar74._0_4_ = uVar29;
        auVar74._8_4_ = uVar29;
        auVar74._12_4_ = uVar29;
        auVar54 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0x90 + lVar46),auVar74,
                                  *(undefined1 (*) [16])(uVar43 + lVar46));
        auVar61 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0xa0 + lVar46),auVar74,
                                  *(undefined1 (*) [16])(uVar43 + 0x10 + lVar46));
        auVar68 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0xb0 + lVar46),auVar74,
                                  *(undefined1 (*) [16])(uVar43 + 0x20 + lVar46));
        auVar55 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0xc0 + lVar46),auVar74,
                                  *(undefined1 (*) [16])(uVar43 + 0x30 + lVar46));
        auVar82 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0xd0 + lVar46),auVar74,
                                  *(undefined1 (*) [16])(uVar43 + 0x40 + lVar46));
        auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0xe0 + lVar46),auVar74,
                                  *(undefined1 (*) [16])(uVar43 + 0x50 + lVar46));
        auVar76 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0xf0 + lVar46),auVar74,
                                  *(undefined1 (*) [16])(uVar43 + 0x60 + lVar46));
        auVar78 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0x100 + lVar46),auVar74,
                                  *(undefined1 (*) [16])(uVar43 + 0x70 + lVar46));
        auVar47 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar43 + 0x110 + lVar46),auVar74,
                                  *(undefined1 (*) [16])(uVar43 + 0x80 + lVar46));
        local_2690 = &local_27b9;
        uVar29 = *(undefined4 *)(ray + k * 4);
        auVar75._4_4_ = uVar29;
        auVar75._0_4_ = uVar29;
        auVar75._8_4_ = uVar29;
        auVar75._12_4_ = uVar29;
        uVar29 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar111._4_4_ = uVar29;
        auVar111._0_4_ = uVar29;
        auVar111._8_4_ = uVar29;
        auVar111._12_4_ = uVar29;
        uVar29 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar117._4_4_ = uVar29;
        auVar117._0_4_ = uVar29;
        auVar117._8_4_ = uVar29;
        auVar117._12_4_ = uVar29;
        local_2740 = vsubps_avx(auVar54,auVar75);
        local_2560 = vsubps_avx(auVar61,auVar111);
        local_2570 = vsubps_avx(auVar68,auVar117);
        auVar54 = vsubps_avx(auVar55,auVar75);
        auVar61 = vsubps_avx(auVar82,auVar111);
        auVar68 = vsubps_avx(auVar57,auVar117);
        auVar55 = vsubps_avx(auVar76,auVar75);
        auVar82 = vsubps_avx(auVar78,auVar111);
        auVar57 = vsubps_avx(auVar47,auVar117);
        local_2580 = vsubps_avx(auVar55,local_2740);
        local_25a0 = vsubps_avx(auVar82,local_2560);
        local_2590 = vsubps_avx(auVar57,local_2570);
        auVar47._0_4_ = auVar55._0_4_ + local_2740._0_4_;
        auVar47._4_4_ = auVar55._4_4_ + local_2740._4_4_;
        auVar47._8_4_ = auVar55._8_4_ + local_2740._8_4_;
        auVar47._12_4_ = auVar55._12_4_ + local_2740._12_4_;
        auVar69._0_4_ = auVar82._0_4_ + local_2560._0_4_;
        auVar69._4_4_ = auVar82._4_4_ + local_2560._4_4_;
        auVar69._8_4_ = auVar82._8_4_ + local_2560._8_4_;
        auVar69._12_4_ = auVar82._12_4_ + local_2560._12_4_;
        fVar2 = local_2570._0_4_;
        auVar76._0_4_ = auVar57._0_4_ + fVar2;
        fVar3 = local_2570._4_4_;
        auVar76._4_4_ = auVar57._4_4_ + fVar3;
        fVar19 = local_2570._8_4_;
        auVar76._8_4_ = auVar57._8_4_ + fVar19;
        fVar9 = local_2570._12_4_;
        auVar76._12_4_ = auVar57._12_4_ + fVar9;
        auVar112._0_4_ = auVar69._0_4_ * local_2590._0_4_;
        auVar112._4_4_ = auVar69._4_4_ * local_2590._4_4_;
        auVar112._8_4_ = auVar69._8_4_ * local_2590._8_4_;
        auVar112._12_4_ = auVar69._12_4_ * local_2590._12_4_;
        auVar78 = vfmsub231ps_fma(auVar112,local_25a0,auVar76);
        auVar77._0_4_ = auVar76._0_4_ * local_2580._0_4_;
        auVar77._4_4_ = auVar76._4_4_ * local_2580._4_4_;
        auVar77._8_4_ = auVar76._8_4_ * local_2580._8_4_;
        auVar77._12_4_ = auVar76._12_4_ * local_2580._12_4_;
        auVar76 = vfmsub231ps_fma(auVar77,local_2590,auVar47);
        auVar48._0_4_ = local_25a0._0_4_ * auVar47._0_4_;
        auVar48._4_4_ = local_25a0._4_4_ * auVar47._4_4_;
        auVar48._8_4_ = local_25a0._8_4_ * auVar47._8_4_;
        auVar48._12_4_ = local_25a0._12_4_ * auVar47._12_4_;
        auVar47 = vfmsub231ps_fma(auVar48,local_2580,auVar69);
        fVar1 = *(float *)(ray + k * 4 + 0x60);
        auVar100._0_4_ = fVar1 * auVar47._0_4_;
        auVar100._4_4_ = fVar1 * auVar47._4_4_;
        auVar100._8_4_ = fVar1 * auVar47._8_4_;
        auVar100._12_4_ = fVar1 * auVar47._12_4_;
        uVar29 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar107._4_4_ = uVar29;
        auVar107._0_4_ = uVar29;
        auVar107._8_4_ = uVar29;
        auVar107._12_4_ = uVar29;
        auVar76 = vfmadd231ps_fma(auVar100,auVar107,auVar76);
        uVar29 = *(undefined4 *)(ray + k * 4 + 0x40);
        local_2780._4_4_ = uVar29;
        local_2780._0_4_ = uVar29;
        local_2780._8_4_ = uVar29;
        local_2780._12_4_ = uVar29;
        local_25d0 = vfmadd231ps_fma(auVar76,local_2780,auVar78);
        local_25b0 = vsubps_avx(local_2560,auVar61);
        local_25c0 = vsubps_avx(local_2570,auVar68);
        auVar70._0_4_ = local_2560._0_4_ + auVar61._0_4_;
        auVar70._4_4_ = local_2560._4_4_ + auVar61._4_4_;
        auVar70._8_4_ = local_2560._8_4_ + auVar61._8_4_;
        auVar70._12_4_ = local_2560._12_4_ + auVar61._12_4_;
        auVar78._0_4_ = fVar2 + auVar68._0_4_;
        auVar78._4_4_ = fVar3 + auVar68._4_4_;
        auVar78._8_4_ = fVar19 + auVar68._8_4_;
        auVar78._12_4_ = fVar9 + auVar68._12_4_;
        fVar11 = local_25c0._0_4_;
        auVar86._0_4_ = auVar70._0_4_ * fVar11;
        fVar13 = local_25c0._4_4_;
        auVar86._4_4_ = auVar70._4_4_ * fVar13;
        fVar15 = local_25c0._8_4_;
        auVar86._8_4_ = auVar70._8_4_ * fVar15;
        fVar17 = local_25c0._12_4_;
        auVar86._12_4_ = auVar70._12_4_ * fVar17;
        auVar47 = vfmsub231ps_fma(auVar86,local_25b0,auVar78);
        auVar76 = vsubps_avx(local_2740,auVar54);
        fVar12 = auVar76._0_4_;
        auVar94._0_4_ = auVar78._0_4_ * fVar12;
        fVar14 = auVar76._4_4_;
        auVar94._4_4_ = auVar78._4_4_ * fVar14;
        fVar16 = auVar76._8_4_;
        auVar94._8_4_ = auVar78._8_4_ * fVar16;
        fVar18 = auVar76._12_4_;
        auVar94._12_4_ = auVar78._12_4_ * fVar18;
        auVar79._0_4_ = local_2740._0_4_ + auVar54._0_4_;
        auVar79._4_4_ = local_2740._4_4_ + auVar54._4_4_;
        auVar79._8_4_ = local_2740._8_4_ + auVar54._8_4_;
        auVar79._12_4_ = local_2740._12_4_ + auVar54._12_4_;
        auVar78 = vfmsub231ps_fma(auVar94,local_25c0,auVar79);
        fVar110 = local_25b0._0_4_;
        auVar80._0_4_ = fVar110 * auVar79._0_4_;
        fVar114 = local_25b0._4_4_;
        auVar80._4_4_ = fVar114 * auVar79._4_4_;
        fVar115 = local_25b0._8_4_;
        auVar80._8_4_ = fVar115 * auVar79._8_4_;
        fVar116 = local_25b0._12_4_;
        auVar80._12_4_ = fVar116 * auVar79._12_4_;
        auVar48 = vfmsub231ps_fma(auVar80,auVar76,auVar70);
        auVar81._0_4_ = fVar1 * auVar48._0_4_;
        auVar81._4_4_ = fVar1 * auVar48._4_4_;
        auVar81._8_4_ = fVar1 * auVar48._8_4_;
        auVar81._12_4_ = fVar1 * auVar48._12_4_;
        auVar78 = vfmadd231ps_fma(auVar81,auVar107,auVar78);
        local_26c0._16_16_ = vfmadd231ps_fma(auVar78,local_2780,auVar47);
        auVar78 = vsubps_avx(auVar54,auVar55);
        auVar62._0_4_ = auVar54._0_4_ + auVar55._0_4_;
        auVar62._4_4_ = auVar54._4_4_ + auVar55._4_4_;
        auVar62._8_4_ = auVar54._8_4_ + auVar55._8_4_;
        auVar62._12_4_ = auVar54._12_4_ + auVar55._12_4_;
        auVar55 = vsubps_avx(auVar61,auVar82);
        auVar56._0_4_ = auVar61._0_4_ + auVar82._0_4_;
        auVar56._4_4_ = auVar61._4_4_ + auVar82._4_4_;
        auVar56._8_4_ = auVar61._8_4_ + auVar82._8_4_;
        auVar56._12_4_ = auVar61._12_4_ + auVar82._12_4_;
        auVar82 = vsubps_avx(auVar68,auVar57);
        auVar83._0_4_ = auVar68._0_4_ + auVar57._0_4_;
        auVar83._4_4_ = auVar68._4_4_ + auVar57._4_4_;
        auVar83._8_4_ = auVar68._8_4_ + auVar57._8_4_;
        auVar83._12_4_ = auVar68._12_4_ + auVar57._12_4_;
        auVar87._0_4_ = auVar82._0_4_ * auVar56._0_4_;
        auVar87._4_4_ = auVar82._4_4_ * auVar56._4_4_;
        auVar87._8_4_ = auVar82._8_4_ * auVar56._8_4_;
        auVar87._12_4_ = auVar82._12_4_ * auVar56._12_4_;
        auVar61 = vfmsub231ps_fma(auVar87,auVar55,auVar83);
        auVar84._0_4_ = auVar83._0_4_ * auVar78._0_4_;
        auVar84._4_4_ = auVar83._4_4_ * auVar78._4_4_;
        auVar84._8_4_ = auVar83._8_4_ * auVar78._8_4_;
        auVar84._12_4_ = auVar83._12_4_ * auVar78._12_4_;
        auVar54 = vfmsub231ps_fma(auVar84,auVar82,auVar62);
        auVar63._0_4_ = auVar55._0_4_ * auVar62._0_4_;
        auVar63._4_4_ = auVar55._4_4_ * auVar62._4_4_;
        auVar63._8_4_ = auVar55._8_4_ * auVar62._8_4_;
        auVar63._12_4_ = auVar55._12_4_ * auVar62._12_4_;
        auVar68 = vfmsub231ps_fma(auVar63,auVar78,auVar56);
        auVar64._0_4_ = fVar1 * auVar68._0_4_;
        auVar64._4_4_ = fVar1 * auVar68._4_4_;
        auVar64._8_4_ = fVar1 * auVar68._8_4_;
        auVar64._12_4_ = fVar1 * auVar68._12_4_;
        auVar54 = vfmadd231ps_fma(auVar64,auVar107,auVar54);
        auVar68 = vfmadd231ps_fma(auVar54,local_2780,auVar61);
        local_26a0._0_4_ = auVar68._0_4_ + local_25d0._0_4_ + local_26c0._16_4_;
        local_26a0._4_4_ = auVar68._4_4_ + local_25d0._4_4_ + local_26c0._20_4_;
        local_26a0._8_4_ = auVar68._8_4_ + local_25d0._8_4_ + local_26c0._24_4_;
        local_26a0._12_4_ = auVar68._12_4_ + local_25d0._12_4_ + local_26c0._28_4_;
        auVar57._8_4_ = 0x7fffffff;
        auVar57._0_8_ = 0x7fffffff7fffffff;
        auVar57._12_4_ = 0x7fffffff;
        auVar54 = vminps_avx(local_25d0,local_26c0._16_16_);
        auVar54 = vminps_avx(auVar54,auVar68);
        local_25e0 = vandps_avx(local_26a0,auVar57);
        auVar95._0_4_ = local_25e0._0_4_ * 1.1920929e-07;
        auVar95._4_4_ = local_25e0._4_4_ * 1.1920929e-07;
        auVar95._8_4_ = local_25e0._8_4_ * 1.1920929e-07;
        auVar95._12_4_ = local_25e0._12_4_ * 1.1920929e-07;
        uVar31 = CONCAT44(auVar95._4_4_,auVar95._0_4_);
        auVar88._0_8_ = uVar31 ^ 0x8000000080000000;
        auVar88._8_4_ = -auVar95._8_4_;
        auVar88._12_4_ = -auVar95._12_4_;
        auVar54 = vcmpps_avx(auVar54,auVar88,5);
        auVar61 = vmaxps_avx(local_25d0,local_26c0._16_16_);
        auVar61 = vmaxps_avx(auVar61,auVar68);
        auVar61 = vcmpps_avx(auVar61,auVar95,2);
        auVar54 = vorps_avx(auVar54,auVar61);
        if ((((auVar54 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar54 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar54 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar54[0xf] < '\0') {
          auVar65._0_4_ = local_2590._0_4_ * fVar110;
          auVar65._4_4_ = local_2590._4_4_ * fVar114;
          auVar65._8_4_ = local_2590._8_4_ * fVar115;
          auVar65._12_4_ = local_2590._12_4_ * fVar116;
          auVar89._0_4_ = fVar12 * local_25a0._0_4_;
          auVar89._4_4_ = fVar14 * local_25a0._4_4_;
          auVar89._8_4_ = fVar16 * local_25a0._8_4_;
          auVar89._12_4_ = fVar18 * local_25a0._12_4_;
          auVar47 = vfmsub213ps_fma(local_25a0,local_25c0,auVar65);
          auVar85._0_4_ = auVar55._0_4_ * fVar11;
          auVar85._4_4_ = auVar55._4_4_ * fVar13;
          auVar85._8_4_ = auVar55._8_4_ * fVar15;
          auVar85._12_4_ = auVar55._12_4_ * fVar17;
          auVar96._0_4_ = fVar12 * auVar82._0_4_;
          auVar96._4_4_ = fVar14 * auVar82._4_4_;
          auVar96._8_4_ = fVar16 * auVar82._8_4_;
          auVar96._12_4_ = fVar18 * auVar82._12_4_;
          auVar82 = vfmsub213ps_fma(auVar82,local_25b0,auVar85);
          auVar61 = vandps_avx(auVar65,auVar57);
          auVar68 = vandps_avx(auVar85,auVar57);
          auVar61 = vcmpps_avx(auVar61,auVar68,1);
          local_2640 = vblendvps_avx(auVar82,auVar47,auVar61);
          auVar104._0_4_ = auVar78._0_4_ * fVar110;
          auVar104._4_4_ = auVar78._4_4_ * fVar114;
          auVar104._8_4_ = auVar78._8_4_ * fVar115;
          auVar104._12_4_ = auVar78._12_4_ * fVar116;
          auVar82 = vfmsub213ps_fma(auVar78,local_25c0,auVar96);
          auVar66._0_4_ = local_2580._0_4_ * fVar11;
          auVar66._4_4_ = local_2580._4_4_ * fVar13;
          auVar66._8_4_ = local_2580._8_4_ * fVar15;
          auVar66._12_4_ = local_2580._12_4_ * fVar17;
          auVar78 = vfmsub213ps_fma(local_2590,auVar76,auVar66);
          auVar61 = vandps_avx(auVar66,auVar57);
          auVar68 = vandps_avx(auVar96,auVar57);
          auVar61 = vcmpps_avx(auVar61,auVar68,1);
          local_2630 = vblendvps_avx(auVar82,auVar78,auVar61);
          auVar82 = vfmsub213ps_fma(local_2580,local_25b0,auVar89);
          auVar55 = vfmsub213ps_fma(auVar55,auVar76,auVar104);
          auVar61 = vandps_avx(auVar89,auVar57);
          auVar68 = vandps_avx(auVar104,auVar57);
          auVar61 = vcmpps_avx(auVar61,auVar68,1);
          local_2620[0] = vblendvps_avx(auVar55,auVar82,auVar61);
          auVar71._0_4_ = local_2620[0]._0_4_ * fVar1;
          auVar71._4_4_ = local_2620[0]._4_4_ * fVar1;
          auVar71._8_4_ = local_2620[0]._8_4_ * fVar1;
          auVar71._12_4_ = local_2620[0]._12_4_ * fVar1;
          auVar61 = vfmadd213ps_fma(auVar107,local_2630,auVar71);
          auVar61 = vfmadd213ps_fma(local_2780,local_2640,auVar61);
          auVar72._0_4_ = auVar61._0_4_ + auVar61._0_4_;
          auVar72._4_4_ = auVar61._4_4_ + auVar61._4_4_;
          auVar72._8_4_ = auVar61._8_4_ + auVar61._8_4_;
          auVar72._12_4_ = auVar61._12_4_ + auVar61._12_4_;
          auVar90._0_4_ = local_2620[0]._0_4_ * fVar2;
          auVar90._4_4_ = local_2620[0]._4_4_ * fVar3;
          auVar90._8_4_ = local_2620[0]._8_4_ * fVar19;
          auVar90._12_4_ = local_2620[0]._12_4_ * fVar9;
          auVar61 = vfmadd213ps_fma(local_2560,local_2630,auVar90);
          auVar68 = vfmadd213ps_fma(local_2740,local_2640,auVar61);
          auVar61 = vrcpps_avx(auVar72);
          auVar105._8_4_ = 0x3f800000;
          auVar105._0_8_ = &DAT_3f8000003f800000;
          auVar105._12_4_ = 0x3f800000;
          auVar55 = vfnmadd213ps_fma(auVar61,auVar72,auVar105);
          auVar61 = vfmadd132ps_fma(auVar55,auVar61,auVar61);
          local_2650._0_4_ = auVar61._0_4_ * (auVar68._0_4_ + auVar68._0_4_);
          local_2650._4_4_ = auVar61._4_4_ * (auVar68._4_4_ + auVar68._4_4_);
          local_2650._8_4_ = auVar61._8_4_ * (auVar68._8_4_ + auVar68._8_4_);
          local_2650._12_4_ = auVar61._12_4_ * (auVar68._12_4_ + auVar68._12_4_);
          auVar53 = ZEXT1664(local_2650);
          uVar29 = *(undefined4 *)(ray + k * 4 + 0x30);
          auVar91._4_4_ = uVar29;
          auVar91._0_4_ = uVar29;
          auVar91._8_4_ = uVar29;
          auVar91._12_4_ = uVar29;
          auVar61 = vcmpps_avx(auVar91,local_2650,2);
          uVar29 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar97._4_4_ = uVar29;
          auVar97._0_4_ = uVar29;
          auVar97._8_4_ = uVar29;
          auVar97._12_4_ = uVar29;
          auVar68 = vcmpps_avx(local_2650,auVar97,2);
          auVar61 = vandps_avx(auVar61,auVar68);
          auVar55 = auVar54 & auVar61;
          if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar55[0xf] < '\0') {
            auVar54 = vandps_avx(auVar54,auVar61);
            auVar61 = vcmpps_avx(auVar72,_DAT_01feba10,4);
            auVar55 = auVar61 & auVar54;
            if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar55[0xf] < '\0') {
              local_2770 = vandps_avx(auVar54,auVar61);
              local_26c0._0_16_ = local_25d0;
              local_2690 = &local_27b9;
              local_2680 = local_2770;
              auVar54 = vrcpps_avx(local_26a0);
              auVar73._8_4_ = 0x3f800000;
              auVar73._0_8_ = &DAT_3f8000003f800000;
              auVar73._12_4_ = 0x3f800000;
              auVar61 = vfnmadd213ps_fma(local_26a0,auVar54,auVar73);
              auVar61 = vfmadd132ps_fma(auVar61,auVar54,auVar54);
              auVar67._8_4_ = 0x219392ef;
              auVar67._0_8_ = 0x219392ef219392ef;
              auVar67._12_4_ = 0x219392ef;
              auVar54 = vcmpps_avx(local_25e0,auVar67,5);
              auVar54 = vandps_avx(auVar61,auVar54);
              auVar49._0_4_ = local_25d0._0_4_ * auVar54._0_4_;
              auVar49._4_4_ = local_25d0._4_4_ * auVar54._4_4_;
              auVar49._8_4_ = local_25d0._8_4_ * auVar54._8_4_;
              auVar49._12_4_ = local_25d0._12_4_ * auVar54._12_4_;
              local_2670 = vminps_avx(auVar49,auVar73);
              auVar50._0_4_ = auVar54._0_4_ * local_26c0._16_4_;
              auVar50._4_4_ = auVar54._4_4_ * local_26c0._20_4_;
              auVar50._8_4_ = auVar54._8_4_ * local_26c0._24_4_;
              auVar50._12_4_ = auVar54._12_4_ * local_26c0._28_4_;
              local_2660 = vminps_avx(auVar50,auVar73);
              auVar51._8_4_ = 0x7f800000;
              auVar51._0_8_ = 0x7f8000007f800000;
              auVar51._12_4_ = 0x7f800000;
              auVar54 = vblendvps_avx(auVar51,local_2650,local_2770);
              auVar61 = vshufps_avx(auVar54,auVar54,0xb1);
              auVar61 = vminps_avx(auVar61,auVar54);
              auVar55 = vshufpd_avx(auVar61,auVar61,1);
              auVar61 = vminps_avx(auVar55,auVar61);
              auVar61 = vcmpps_avx(auVar54,auVar61,0);
              auVar55 = local_2770 & auVar61;
              auVar54 = local_2770;
              if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar55[0xf] < '\0') {
                auVar54 = vandps_avx(auVar61,local_2770);
              }
              lVar46 = lVar46 + uVar43;
              uVar29 = vmovmskps_avx(auVar54);
              lVar44 = 0;
              for (uVar31 = CONCAT44((int)((ulong)&local_27b9 >> 0x20),uVar29); (uVar31 & 1) == 0;
                  uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                lVar44 = lVar44 + 1;
              }
              auVar54 = vpcmpeqd_avx(auVar68,auVar68);
              auVar93 = ZEXT1664(auVar54);
              uStack_2798 = auVar107._8_8_;
              local_27a0 = context->scene;
              pSVar33 = context->scene;
              do {
                uVar6 = *(uint *)(lVar46 + 0x120 + lVar44 * 4);
                pRVar32 = (RayHitK<4> *)(ulong)uVar6;
                pGVar8 = (pSVar33->geometries).items[(long)pRVar32].ptr;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  *(undefined4 *)(local_2770 + lVar44 * 4) = 0;
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar29 = *(undefined4 *)(local_2670 + lVar44 * 4);
                    uVar4 = *(undefined4 *)(local_2660 + lVar44 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2650 + lVar44 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2640 + lVar44 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2630 + lVar44 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xe0) =
                         *(undefined4 *)(local_2620[0] + lVar44 * 4);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar29;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)(lVar46 + 0x130 + lVar44 * 4);
                    *(uint *)(ray + k * 4 + 0x120) = uVar6;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    unaff_R13 = local_2748;
                    break;
                  }
                  uVar29 = *(undefined4 *)(local_2670 + lVar44 * 4);
                  local_2520._4_4_ = uVar29;
                  local_2520._0_4_ = uVar29;
                  local_2520._8_4_ = uVar29;
                  local_2520._12_4_ = uVar29;
                  local_2510 = *(undefined4 *)(local_2660 + lVar44 * 4);
                  local_24f0._4_4_ = uVar6;
                  local_24f0._0_4_ = uVar6;
                  local_24f0._8_4_ = uVar6;
                  local_24f0._12_4_ = uVar6;
                  uVar29 = *(undefined4 *)(lVar46 + 0x130 + lVar44 * 4);
                  local_2500._4_4_ = uVar29;
                  local_2500._0_4_ = uVar29;
                  local_2500._8_4_ = uVar29;
                  local_2500._12_4_ = uVar29;
                  uVar29 = *(undefined4 *)(local_2640 + lVar44 * 4);
                  local_2550._4_4_ = uVar29;
                  local_2550._0_4_ = uVar29;
                  local_2550._8_4_ = uVar29;
                  local_2550._12_4_ = uVar29;
                  uVar29 = *(undefined4 *)(local_2630 + lVar44 * 4);
                  local_2540._4_4_ = uVar29;
                  local_2540._0_4_ = uVar29;
                  local_2540._8_4_ = uVar29;
                  local_2540._12_4_ = uVar29;
                  uVar29 = *(undefined4 *)(local_2620[0] + lVar44 * 4);
                  local_2530._4_4_ = uVar29;
                  local_2530._0_4_ = uVar29;
                  local_2530._8_4_ = uVar29;
                  local_2530._12_4_ = uVar29;
                  uStack_250c = local_2510;
                  uStack_2508 = local_2510;
                  uStack_2504 = local_2510;
                  vpcmpeqd_avx2(ZEXT1632(local_2520),ZEXT1632(local_2520));
                  uStack_24dc = context->user->instID[0];
                  local_24e0 = uStack_24dc;
                  uStack_24d8 = uStack_24dc;
                  uStack_24d4 = uStack_24dc;
                  uStack_24d0 = context->user->instPrimID[0];
                  uStack_24cc = uStack_24d0;
                  uStack_24c8 = uStack_24d0;
                  uStack_24c4 = uStack_24d0;
                  local_2780._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2650 + lVar44 * 4);
                  local_2730 = *local_2718;
                  uStack_2728 = local_2718[1];
                  local_26f0 = &local_2730;
                  local_26e8 = pGVar8->userPtr;
                  local_26e0 = context->user;
                  local_26d0 = &local_2550;
                  local_26c8 = 4;
                  pRVar32 = (RayHitK<4> *)pGVar8->intersectionFilterN;
                  local_2790 = auVar53._0_16_;
                  local_2758 = lVar39;
                  local_2750 = lVar34;
                  local_26d8 = ray;
                  if (pRVar32 != (RayHitK<4> *)0x0) {
                    local_2740._0_8_ = pauVar42;
                    auVar54 = auVar93._0_16_;
                    pRVar32 = (RayHitK<4> *)(*(code *)pRVar32)(&local_26f0);
                    auVar53 = ZEXT1664(local_2790);
                    auVar54 = vpcmpeqd_avx(auVar54,auVar54);
                    auVar93 = ZEXT1664(auVar54);
                    uVar35 = local_27b0;
                    uVar40 = local_27b8;
                    ray = local_27a8;
                    pauVar42 = (undefined1 (*) [16])local_2740._0_8_;
                  }
                  auVar26._8_8_ = uStack_2728;
                  auVar26._0_8_ = local_2730;
                  auVar54 = auVar93._0_16_;
                  if (auVar26 == (undefined1  [16])0x0) {
                    auVar61 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                    auVar61 = auVar61 ^ auVar54;
                    lVar34 = local_2750;
                    lVar39 = local_2758;
                  }
                  else {
                    pRVar32 = (RayHitK<4> *)context->args->filter;
                    if ((pRVar32 != (RayHitK<4> *)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      pRVar32 = (RayHitK<4> *)(*(code *)pRVar32)(&local_26f0);
                      auVar53 = ZEXT1664(local_2790);
                      auVar54 = vpcmpeqd_avx(auVar54,auVar54);
                      auVar93 = ZEXT1664(auVar54);
                      uVar35 = local_27b0;
                      uVar40 = local_27b8;
                      ray = local_27a8;
                    }
                    auVar27._8_8_ = uStack_2728;
                    auVar27._0_8_ = local_2730;
                    auVar54 = vpcmpeqd_avx(auVar27,_DAT_01feba10);
                    auVar61 = auVar54 ^ auVar93._0_16_;
                    lVar34 = local_2750;
                    lVar39 = local_2758;
                    if (auVar27 != (undefined1  [16])0x0) {
                      auVar54 = auVar54 ^ auVar93._0_16_;
                      auVar68 = vmaskmovps_avx(auVar54,*local_26d0);
                      *(undefined1 (*) [16])(local_26d8 + 0xc0) = auVar68;
                      auVar68 = vmaskmovps_avx(auVar54,local_26d0[1]);
                      *(undefined1 (*) [16])(local_26d8 + 0xd0) = auVar68;
                      auVar68 = vmaskmovps_avx(auVar54,local_26d0[2]);
                      *(undefined1 (*) [16])(local_26d8 + 0xe0) = auVar68;
                      auVar68 = vmaskmovps_avx(auVar54,local_26d0[3]);
                      *(undefined1 (*) [16])(local_26d8 + 0xf0) = auVar68;
                      auVar68 = vmaskmovps_avx(auVar54,local_26d0[4]);
                      *(undefined1 (*) [16])(local_26d8 + 0x100) = auVar68;
                      auVar68 = vmaskmovps_avx(auVar54,local_26d0[5]);
                      *(undefined1 (*) [16])(local_26d8 + 0x110) = auVar68;
                      auVar68 = vmaskmovps_avx(auVar54,local_26d0[6]);
                      *(undefined1 (*) [16])(local_26d8 + 0x120) = auVar68;
                      auVar68 = vmaskmovps_avx(auVar54,local_26d0[7]);
                      *(undefined1 (*) [16])(local_26d8 + 0x130) = auVar68;
                      auVar54 = vmaskmovps_avx(auVar54,local_26d0[8]);
                      *(undefined1 (*) [16])(local_26d8 + 0x140) = auVar54;
                      pRVar32 = local_26d8;
                    }
                  }
                  auVar59._8_8_ = 0x100000001;
                  auVar59._0_8_ = 0x100000001;
                  if ((auVar59 & auVar61) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_2780._0_4_;
                  }
                  *(undefined4 *)(local_2770 + lVar44 * 4) = 0;
                  uVar29 = *(undefined4 *)(ray + k * 4 + 0x80);
                  auVar52._4_4_ = uVar29;
                  auVar52._0_4_ = uVar29;
                  auVar52._8_4_ = uVar29;
                  auVar52._12_4_ = uVar29;
                  auVar54 = vcmpps_avx(auVar53._0_16_,auVar52,2);
                  local_2770 = vandps_avx(auVar54,local_2770);
                }
                unaff_R13 = local_2748;
                if ((((local_2770 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (local_2770 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (local_2770 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < local_2770[0xf]) break;
                auVar58._8_4_ = 0x7f800000;
                auVar58._0_8_ = 0x7f8000007f800000;
                auVar58._12_4_ = 0x7f800000;
                auVar54 = vblendvps_avx(auVar58,auVar53._0_16_,local_2770);
                auVar61 = vshufps_avx(auVar54,auVar54,0xb1);
                auVar61 = vminps_avx(auVar61,auVar54);
                auVar68 = vshufpd_avx(auVar61,auVar61,1);
                auVar61 = vminps_avx(auVar68,auVar61);
                auVar61 = vcmpps_avx(auVar54,auVar61,0);
                auVar68 = local_2770 & auVar61;
                auVar54 = local_2770;
                if ((((auVar68 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar68[0xf] < '\0') {
                  auVar54 = vandps_avx(auVar61,local_2770);
                }
                uVar29 = vmovmskps_avx(auVar54);
                lVar44 = 0;
                for (uVar31 = CONCAT44((int)((ulong)pRVar32 >> 0x20),uVar29); pSVar33 = local_27a0,
                    (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                  lVar44 = lVar44 + 1;
                }
              } while( true );
            }
          }
        }
        lVar39 = lVar39 + 1;
      } while (lVar39 != lVar34);
    }
    uVar29 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar53 = ZEXT3264(CONCAT428(uVar29,CONCAT424(uVar29,CONCAT420(uVar29,CONCAT416(uVar29,CONCAT412
                                                  (uVar29,CONCAT48(uVar29,CONCAT44(uVar29,uVar29))))
                                                  ))));
    auVar93 = ZEXT3264(local_23c0);
    auVar99 = ZEXT3264(local_23e0);
    auVar102 = ZEXT3264(local_2400);
    auVar103 = ZEXT3264(local_2420);
    auVar106 = ZEXT3264(local_2440);
    auVar108 = ZEXT3264(local_2460);
    auVar109 = ZEXT3264(local_2480);
    auVar113 = ZEXT3264(local_24a0);
    auVar118 = ZEXT3264(local_24c0);
    auVar119 = ZEXT3264(local_2600);
    uVar31 = local_2708;
    uVar45 = local_2710;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }